

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileGuard.h
# Opt level: O2

void __thiscall jbcoin::KeyFileGuard::rmDir(KeyFileGuard *this,path *toRm)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = boost::filesystem::is_directory(toRm);
  if (bVar1) {
    boost::filesystem::remove_all(toRm);
    return;
  }
  poVar2 = std::operator<<(&(this->test_->log).super_basic_ostream<char,_std::char_traits<char>_>,
                           "Expected ");
  poVar2 = std::operator<<(poVar2,(string *)toRm);
  poVar2 = std::operator<<(poVar2," to be an existing directory.");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

auto rmDir (path const& toRm)
    {
        if (is_directory (toRm))
            remove_all (toRm);
        else
            test_.log << "Expected " << toRm.string ()
                      << " to be an existing directory." << std::endl;
    }